

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::Int64Parameter::MergePartialFromCodedStream
          (Int64Parameter *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  bool bVar4;
  uint32 uVar5;
  uint uVar6;
  int iVar7;
  unsigned_long uVar8;
  Int64Range *this_00;
  Int64Set *this_01;
  pair<int,_int> pVar9;
  char cVar10;
  ulong uVar11;
  pair<unsigned_long,_bool> pVar12;
  
LAB_004c0b4b:
  pbVar2 = input->buffer_;
  uVar5 = 0;
  if (pbVar2 < input->buffer_end_) {
    bVar1 = *pbVar2;
    uVar5 = (uint32)bVar1;
    if ((char)bVar1 < '\x01') goto LAB_004c0b6e;
    input->buffer_ = pbVar2 + 1;
    uVar11 = (ulong)bVar1 | 0x100000000;
  }
  else {
LAB_004c0b6e:
    uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
    uVar11 = 0;
    if (uVar5 - 1 < 0x7f) {
      uVar11 = 0x100000000;
    }
    uVar11 = uVar5 | uVar11;
  }
  uVar5 = (uint32)uVar11;
  if ((uVar11 & 0x100000000) != 0) {
    uVar6 = (uint)(uVar11 >> 3) & 0x1fffffff;
    cVar10 = (char)uVar11;
    if (uVar6 == 0xb) {
      if (cVar10 != 'Z') goto LAB_004c0b8f;
      if (this->_oneof_case_[0] == 0xb) {
        this_01 = (this->AllowedValues_).set_;
      }
      else {
        clear_AllowedValues(this);
        this->_oneof_case_[0] = 0xb;
        this_01 = (Int64Set *)operator_new(0x28);
        Int64Set::Int64Set(this_01);
        (this->AllowedValues_).set_ = this_01;
      }
      puVar3 = input->buffer_;
      if ((puVar3 < input->buffer_end_) && (iVar7 = (int)(char)*puVar3, -1 < iVar7)) {
        input->buffer_ = puVar3 + 1;
      }
      else {
        iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar7 < 0) {
          return false;
        }
      }
      pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                        (input,iVar7);
      if ((long)pVar9 < 0) {
        return false;
      }
      bVar4 = Int64Set::MergePartialFromCodedStream(this_01,input);
LAB_004c0d0d:
      if (bVar4 == false) {
        return false;
      }
      bVar4 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                        (input,pVar9.first);
      goto LAB_004c0baf;
    }
    if (uVar6 == 10) {
      if (cVar10 == 'R') {
        if (this->_oneof_case_[0] == 10) {
          this_00 = (this->AllowedValues_).range_;
        }
        else {
          clear_AllowedValues(this);
          this->_oneof_case_[0] = 10;
          this_00 = (Int64Range *)operator_new(0x28);
          Int64Range::Int64Range(this_00);
          (this->AllowedValues_).range_ = this_00;
        }
        puVar3 = input->buffer_;
        if ((puVar3 < input->buffer_end_) && (iVar7 = (int)(char)*puVar3, -1 < iVar7)) {
          input->buffer_ = puVar3 + 1;
        }
        else {
          iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar7 < 0) {
            return false;
          }
        }
        pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                          (input,iVar7);
        if ((long)pVar9 < 0) {
          return false;
        }
        bVar4 = Int64Range::MergePartialFromCodedStream(this_00,input);
        goto LAB_004c0d0d;
      }
      goto LAB_004c0b8f;
    }
    if ((uVar6 == 1) && (cVar10 == '\b')) {
      puVar3 = input->buffer_;
      if ((puVar3 < input->buffer_end_) && (uVar8 = (unsigned_long)(char)*puVar3, -1 < (long)uVar8))
      {
        input->buffer_ = puVar3 + 1;
      }
      else {
        pVar12 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        uVar8 = pVar12.first;
        if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      this->defaultvalue_ = uVar8;
      goto LAB_004c0b4b;
    }
  }
LAB_004c0b8f:
  if (uVar5 == 0) {
    return true;
  }
  if ((uVar5 & 7) == 4) {
    return true;
  }
  bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar5);
LAB_004c0baf:
  if (bVar4 == false) {
    return false;
  }
  goto LAB_004c0b4b;
}

Assistant:

bool Int64Parameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.Int64Parameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // int64 defaultValue = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &defaultvalue_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Int64Range range = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_range()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Int64Set set = 11;
      case 11: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(90u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_set()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.Int64Parameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.Int64Parameter)
  return false;
#undef DO_
}